

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O0

void EpdSubtract(EpDouble *epd1,double value)

{
  double dVar1;
  int iVar2;
  double dVar3;
  int sign;
  int diff;
  int exponent;
  double tmp;
  EpDouble epd2;
  double value_local;
  EpDouble *epd1_local;
  
  epd2._8_8_ = value;
  iVar2 = EpdIsNan(epd1);
  if ((iVar2 == 0) && (iVar2 = IsNanDouble((double)epd2._8_8_), iVar2 == 0)) {
    iVar2 = EpdIsInf(epd1);
    if ((iVar2 == 0) && (iVar2 = IsInfDouble((double)epd2._8_8_), iVar2 == 0)) {
      if ((SUB84(epd1->type,4) >> 0x14 & 0x7ff) != 0x3ff) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/epd/epd.c"
                      ,0x2ed,"void EpdSubtract(EpDouble *, double)");
      }
      EpdConvert((double)epd2._8_8_,(EpDouble *)&tmp);
      if ((int)epd2.type._0_4_ < epd1->exponent) {
        iVar2 = epd1->exponent - epd2.type._0_4_;
        if (iVar2 < 0x400) {
          dVar1 = (epd1->type).value;
          dVar3 = pow(2.0,(double)iVar2);
          _diff = dVar1 - tmp / dVar3;
        }
        else {
          _diff = epd1->type;
        }
        sign = epd1->exponent;
      }
      else if (epd1->exponent < (int)epd2.type._0_4_) {
        iVar2 = epd2.type._0_4_ - epd1->exponent;
        if (iVar2 < 0x400) {
          dVar1 = (epd1->type).value;
          dVar3 = pow(2.0,(double)iVar2);
          _diff = dVar1 / dVar3 - tmp;
        }
        else {
          _diff = tmp * -1.0;
        }
        sign = epd2.type._0_4_;
      }
      else {
        _diff = (epd1->type).value - tmp;
        sign = epd1->exponent;
      }
      (epd1->type).value = (double)_diff;
      epd1->exponent = sign;
      EpdNormalize(epd1);
    }
    else {
      EpdConvert((double)epd2._8_8_,(EpDouble *)&tmp);
      iVar2 = EpdIsInf(epd1);
      if ((iVar2 == 0) || (iVar2 = IsInfDouble((double)epd2._8_8_), iVar2 == 0)) {
        iVar2 = EpdIsInf((EpDouble *)&tmp);
        if (iVar2 != 0) {
          EpdCopy((EpDouble *)&tmp,epd1);
        }
      }
      else if (-1 < (int)(SUB84(epd1->type,4) ^ tmp._4_4_)) {
        EpdMakeNan(epd1);
      }
    }
  }
  else {
    EpdMakeNan(epd1);
  }
  return;
}

Assistant:

void
EpdSubtract(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent, diff;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    if (EpdIsInf(epd1) && IsInfDouble(value)) {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(&epd2)) {
      EpdCopy(&epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  if (epd1->exponent > epd2.exponent) {
    diff = epd1->exponent - epd2.exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value - epd2.type.value / pow((double)2.0, (double)diff);
    else
      tmp = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2.exponent) {
    diff = epd2.exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value / pow((double)2.0, (double)diff) - epd2.type.value;
    else
      tmp = epd2.type.value * (double)(-1.0);
    exponent = epd2.exponent;
  } else {
    tmp = epd1->type.value - epd2.type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}